

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_att.c
# Opt level: O0

int X509_ATTRIBUTE_set1_data(X509_ATTRIBUTE *attr,int attrtype,void *data,int len)

{
  int iVar1;
  int iVar2;
  OPENSSL_STACK *st;
  int atype;
  ASN1_STRING *stmp;
  ASN1_TYPE *ttmp;
  uchar *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int type;
  ASN1_STRING *local_38;
  ASN1_TYPE *local_30;
  
  local_30 = (ASN1_TYPE *)0x0;
  local_38 = (ASN1_STRING *)0x0;
  type = 0;
  if (attr == (X509_ATTRIBUTE *)0x0) {
    return 0;
  }
  if ((attrtype & 0x1000U) == 0) {
    iVar1 = type;
    if ((len != -1) &&
       ((local_38 = ASN1_STRING_type_new(attrtype), local_38 == (ASN1_STRING *)0x0 ||
        (iVar2 = ASN1_STRING_set((ASN1_STRING *)local_38,data,len), iVar1 = attrtype, iVar2 == 0))))
    goto LAB_002cdaf1;
  }
  else {
    in_stack_ffffffffffffffb0 = (uchar *)data;
    in_stack_ffffffffffffffbc = len;
    in_stack_ffffffffffffffc0 = attrtype;
    iVar1 = OBJ_obj2nid(attr->object);
    local_38 = ASN1_STRING_set_by_NID
                         ((ASN1_STRING **)0x0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffc0,iVar1);
    if (local_38 == (ASN1_STRING *)0x0) {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(type,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
                    (char *)in_stack_ffffffffffffffb0);
      ERR_set_error(0xb,0x8000d,(char *)0x0);
      return 0;
    }
    iVar1 = local_38->type;
  }
  type = iVar1;
  if (attrtype == 0) {
    ASN1_STRING_free(local_38);
    return 1;
  }
  local_30 = ASN1_TYPE_new();
  if (local_30 != (ASN1_TYPE *)0x0) {
    if ((len == -1) && ((attrtype & 0x1000U) == 0)) {
      iVar1 = ASN1_TYPE_set1(local_30,attrtype,data);
      if (iVar1 == 0) goto LAB_002cdaf1;
    }
    else {
      ASN1_TYPE_set(local_30,type,local_38);
      local_38 = (ASN1_STRING *)0x0;
    }
    st = ossl_check_ASN1_TYPE_sk_type(*(stack_st_ASN1_TYPE **)&attr->single);
    ossl_check_ASN1_TYPE_type((ASN1_TYPE *)local_30);
    iVar1 = OPENSSL_sk_push(st,(void *)0x2cdae0);
    if (iVar1 != 0) {
      return 1;
    }
  }
LAB_002cdaf1:
  ERR_new();
  ERR_set_debug((char *)CONCAT44(type,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
                (char *)in_stack_ffffffffffffffb0);
  ERR_set_error(0xb,0xc0100,(char *)0x0);
  ASN1_TYPE_free(local_30);
  ASN1_STRING_free(local_38);
  return 0;
}

Assistant:

int X509_ATTRIBUTE_set1_data(X509_ATTRIBUTE *attr, int attrtype,
                             const void *data, int len)
{
    ASN1_TYPE *ttmp = NULL;
    ASN1_STRING *stmp = NULL;
    int atype = 0;
    if (!attr)
        return 0;
    if (attrtype & MBSTRING_FLAG) {
        stmp = ASN1_STRING_set_by_NID(NULL, data, len, attrtype,
                                      OBJ_obj2nid(attr->object));
        if (!stmp) {
            ERR_raise(ERR_LIB_X509, ERR_R_ASN1_LIB);
            return 0;
        }
        atype = stmp->type;
    } else if (len != -1) {
        if ((stmp = ASN1_STRING_type_new(attrtype)) == NULL)
            goto err;
        if (!ASN1_STRING_set(stmp, data, len))
            goto err;
        atype = attrtype;
    }
    /*
     * This is a bit naughty because the attribute should really have at
     * least one value but some types use and zero length SET and require
     * this.
     */
    if (attrtype == 0) {
        ASN1_STRING_free(stmp);
        return 1;
    }
    if ((ttmp = ASN1_TYPE_new()) == NULL)
        goto err;
    if ((len == -1) && !(attrtype & MBSTRING_FLAG)) {
        if (!ASN1_TYPE_set1(ttmp, attrtype, data))
            goto err;
    } else {
        ASN1_TYPE_set(ttmp, atype, stmp);
        stmp = NULL;
    }
    if (!sk_ASN1_TYPE_push(attr->set, ttmp))
        goto err;
    return 1;
 err:
    ERR_raise(ERR_LIB_X509, ERR_R_MALLOC_FAILURE);
    ASN1_TYPE_free(ttmp);
    ASN1_STRING_free(stmp);
    return 0;
}